

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# difference.hpp
# Opt level: O2

iterator_range<burst::difference_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_std::less<void>_>_>
* __thiscall
burst::
difference<std::vector<char,std::allocator<char>>const&,std::vector<char,std::allocator<char>>const&>
          (iterator_range<burst::difference_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_std::less<void>_>_>
           *__return_storage_ptr__,burst *this,vector<char,_std::allocator<char>_> *minuend,
          vector<char,_std::allocator<char>_> *subtrahend)

{
  difference_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_std::less<void>_>
  begin;
  difference_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_std::less<void>_>
  local_38;
  
  make_difference_iterator<std::vector<char,std::allocator<char>>const&,std::vector<char,std::allocator<char>>const&,void>
            (&local_38,this,minuend,subtrahend);
  (__return_storage_ptr__->
  super_iterator_range_base<burst::difference_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_std::less<void>_>,_boost::iterators::incrementable_traversal_tag>
  ).m_End.m_subtrahend_begin._M_current = (char *)0x0;
  (__return_storage_ptr__->
  super_iterator_range_base<burst::difference_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_std::less<void>_>,_boost::iterators::incrementable_traversal_tag>
  ).m_End.m_subtrahend_end._M_current = (char *)0x0;
  (__return_storage_ptr__->
  super_iterator_range_base<burst::difference_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_std::less<void>_>,_boost::iterators::incrementable_traversal_tag>
  ).m_Begin.m_minuend_begin._M_current = local_38.m_minuend_begin._M_current;
  (__return_storage_ptr__->
  super_iterator_range_base<burst::difference_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_std::less<void>_>,_boost::iterators::incrementable_traversal_tag>
  ).m_Begin.m_minuend_end._M_current = local_38.m_minuend_end._M_current;
  (__return_storage_ptr__->
  super_iterator_range_base<burst::difference_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_std::less<void>_>,_boost::iterators::incrementable_traversal_tag>
  ).m_Begin.m_subtrahend_begin._M_current = local_38.m_subtrahend_begin._M_current;
  (__return_storage_ptr__->
  super_iterator_range_base<burst::difference_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_std::less<void>_>,_boost::iterators::incrementable_traversal_tag>
  ).m_Begin.m_subtrahend_end._M_current = local_38.m_subtrahend_end._M_current;
  *(undefined8 *)
   &(__return_storage_ptr__->
    super_iterator_range_base<burst::difference_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_std::less<void>_>,_boost::iterators::incrementable_traversal_tag>
    ).m_Begin.field_0x20 = local_38._32_8_;
  (__return_storage_ptr__->
  super_iterator_range_base<burst::difference_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_std::less<void>_>,_boost::iterators::incrementable_traversal_tag>
  ).m_End.m_minuend_begin._M_current = local_38.m_minuend_end._M_current;
  (__return_storage_ptr__->
  super_iterator_range_base<burst::difference_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_std::less<void>_>,_boost::iterators::incrementable_traversal_tag>
  ).m_End.m_minuend_end._M_current = local_38.m_minuend_end._M_current;
  return __return_storage_ptr__;
}

Assistant:

auto difference (ForwardRange1 && minuend, ForwardRange2 && subtrahend)
    {
        auto begin =
            make_difference_iterator
            (
                std::forward<ForwardRange1>(minuend),
                std::forward<ForwardRange2>(subtrahend)
            );
        auto end = make_difference_iterator(iterator::end_tag, begin);

        return boost::make_iterator_range(std::move(begin), std::move(end));
    }